

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_generator.cpp
# Opt level: O2

LabelId __thiscall
front::irGenerator::irGenerator::LeftValueToLabelId(irGenerator *this,LeftVal *leftVal)

{
  LabelId LVar1;
  variant_alternative_t<1UL,_variant<int,_basic_string<char>_>_> *pvVar2;
  variant_alternative_t<0UL,_variant<int,_basic_string<char>_>_> *pvVar3;
  string local_30;
  
  if ((leftVal->
      super__Variant_base<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ).super__Move_assign_alias<int,_std::__cxx11::basic_string<char>_>.
      super__Copy_assign_alias<int,_std::__cxx11::basic_string<char>_>.
      super__Move_ctor_alias<int,_std::__cxx11::basic_string<char>_>.
      super__Copy_ctor_alias<int,_std::__cxx11::basic_string<char>_>.
      super__Variant_storage_alias<int,_std::__cxx11::basic_string<char>_>._M_index == '\0') {
    pvVar3 = std::get<0ul,int,std::__cxx11::string>(leftVal);
    LVar1 = *pvVar3;
  }
  else {
    pvVar2 = std::get<1ul,int,std::__cxx11::string>(leftVal);
    std::__cxx11::string::string((string *)&local_30,(string *)pvVar2);
    LVar1 = nameToLabelId(this,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return LVar1;
}

Assistant:

LabelId irGenerator::LeftValueToLabelId(LeftVal leftVal) {
  LabelId id;
  switch (leftVal.index()) {
    case 0:
      id = get<LabelId>(leftVal);
      break;
    case 1:
      id = nameToLabelId(get<string>(leftVal));
      break;
  }
  return id;
}